

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  XmlOutput *pXVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar5.m_data = (storage_type *)0x4;
  QVar5.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar5);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar3;
  pXVar4 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QVar6.m_data = (storage_type *)0xf;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar6);
  local_a8.xo_value.d.size = (qsizetype)local_a8.xo_text.d.ptr;
  local_a8.xo_value.d.ptr = (char16_t *)local_a8.xo_text.d.d;
  pQVar2 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
  if (local_a8.xo_text.d.ptr == (char16_t *)0x0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar7.m_data = (storage_type *)0x4;
    QVar7.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar7);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar1;
    local_a8.xo_value.d.d = (Data *)pQVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_a8);
  attrX(&local_e0,"AdditionalDependencies",(QStringList *)((long)__buf + 8),",");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_e0);
  attrX(&local_118,"AdditionalLibraryDirectories",(QStringList *)((long)__buf + 0x20),",");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_118);
  attrX(&local_150,"AdditionalOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_150);
  attrX(&local_188,"ExportNamedFunctions",(QStringList *)((long)__buf + 0x50),",");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_188);
  attrX(&local_1c0,"ForceSymbolReferences",(QStringList *)((long)__buf + 0x68),",");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_1c0);
  attrT(&local_1f8,"IgnoreAllDefaultLibraries",*(triState *)((long)__buf + 0x80));
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_1f8);
  attrX(&local_230,"IgnoreDefaultLibraryNames",(QStringList *)((long)__buf + 0x88),",");
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_230);
  if (*(long *)((long)__buf + 0xb0) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar8.m_data = (storage_type *)0x14;
    QVar8.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar8);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tAttribute;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0xa0);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xa8);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 0xb0);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar1;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_268);
  if (*(long *)((long)__buf + 200) == 0) {
    local_2a0.xo_type = tNothing;
    local_2a0.xo_text.d.d = (Data *)0x0;
    local_2a0.xo_text.d.ptr = (char16_t *)0x0;
    local_2a0.xo_text.d.size = 0;
    local_2a0.xo_value.d.d = (Data *)0x0;
    local_2a0.xo_value.d.ptr = (char16_t *)0x0;
    local_2a0.xo_value.d.size = 0;
  }
  else {
    QVar9.m_data = (storage_type *)0xa;
    QVar9.m_size = (qsizetype)&local_2a0;
    QString::fromUtf8(QVar9);
    local_2a0.xo_text.d.size = (qsizetype)local_2a0.xo_text.d.ptr;
    pQVar1 = (QArrayData *)CONCAT44(local_2a0._4_4_,local_2a0.xo_type);
    local_2a0.xo_type = tAttribute;
    local_2a0.xo_text.d.ptr = (char16_t *)local_2a0.xo_text.d.d;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2a0.xo_value.d.d = *(Data **)((long)__buf + 0xb8);
    local_2a0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0xc0);
    local_2a0.xo_value.d.size = *(qsizetype *)((long)__buf + 200);
    if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2a0.xo_text.d.d = (Data *)pQVar1;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_2a0);
  attrT(&local_2d8,"SuppressStartupBanner",*(triState *)((long)__buf + 0xd0));
  pXVar4 = XmlOutput::operator<<(pXVar4,&local_2d8);
  QVar10.m_data = (storage_type *)0x4;
  QVar10.m_size = (qsizetype)&local_310;
  QString::fromUtf8(QVar10);
  local_310.xo_text.d.size = (qsizetype)local_310.xo_text.d.ptr;
  pQVar1 = (QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type);
  local_310.xo_type = tCloseTag;
  local_310.xo_text.d.ptr = (char16_t *)local_310.xo_text.d.d;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_310.xo_value.d.d = (Data *)0x0;
  local_310.xo_value.d.ptr = (char16_t *)0x0;
  local_310.xo_value.d.size = 0;
  local_310.xo_text.d.d = (Data *)pQVar1;
  XmlOutput::operator<<(pXVar4,&local_310);
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Tool)
            << attrS(_Name, _VCLibrarianTool)
            << attrX(_AdditionalDependencies, tool.AdditionalDependencies)
            << attrX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories)
            << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrX(_ExportNamedFunctions, tool.ExportNamedFunctions)
            << attrX(_ForceSymbolReferences, tool.ForceSymbolReferences)
            << attrT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrX(_IgnoreDefaultLibraryNames, tool.IgnoreDefaultLibraryNames)
            << attrS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrS(_OutputFile, tool.OutputFile)
            << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Tool);
}